

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O1

int scanForQuads(StructureConfig sconf,int radius,uint64_t s48,uint64_t *lowBits,int lowBitN,
                uint64_t salt,int x,int z,int w,int h,Pos *qplist,int n)

{
  char cVar1;
  int iVar2;
  int extraout_EAX;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int extraout_EDX;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  uint64_t uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  int reg;
  bool bVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint uVar46;
  uint uVar47;
  uint uVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float __x;
  float fVar49;
  uint uVar50;
  uint uVar53;
  uint uVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  uint uVar66;
  uint uVar67;
  undefined1 auVar65 [16];
  uint uVar68;
  uint uStackY_170;
  uint uStackY_16c;
  uint uStack_164;
  int C;
  ulong local_110;
  int R;
  int local_fc;
  int local_dc;
  uint8_t local_98;
  
  if (lowBitN == 0x14) {
    lVar17 = 0x2057d;
  }
  else if (lowBitN == 0x30) {
    lVar17 = 0xc0654be2057d;
  }
  else {
    uVar25 = 1L << ((byte)lowBitN & 0x3f);
    if ((long)uVar25 < 2) {
      lVar17 = 0;
    }
    else {
      lVar17 = 0;
      uVar3 = 0x1ef1565bd5;
      uVar28 = uVar25;
      lVar4 = 0;
      lVar29 = 1;
      do {
        lVar11 = lVar4;
        if (uVar28 == 0) goto LAB_0012a488;
        uVar5 = uVar3 / uVar28;
        uVar15 = uVar3 % uVar28;
        bVar38 = 1 < (long)uVar28;
        uVar3 = uVar28;
        uVar28 = uVar15;
        lVar4 = lVar29 - uVar5 * lVar11;
        lVar29 = lVar11;
      } while (bVar38);
      lVar17 = (lVar11 >> 0x3f & uVar25) + lVar11;
    }
  }
LAB_0012a488:
  uVar27 = *lowBits;
  if (uVar27 == 0) {
    local_fc = 0;
  }
  else {
    lVar29 = 1L << ((byte)lowBitN & 0x3f);
    uVar25 = (ulong)z;
    lVar4 = (long)sconf.salt;
    reg = sconf._1_4_ >> 0x18;
    iVar20 = sconf._2_4_ >> 0x18;
    iVar2 = radius + 7;
    if (-1 < radius) {
      iVar2 = radius;
    }
    uVar6 = (iVar2 >> 3) * (iVar2 >> 3);
    iVar2 = (reg - iVar20) + 1;
    __x = (float)(int)(uVar6 - iVar2 * iVar2);
    fVar39 = (float)radius;
    iVar7 = radius * -2 + 0x41;
    iVar2 = radius * -2 + 0x48;
    if (-1 < iVar7) {
      iVar2 = iVar7;
    }
    iVar2 = (iVar2 >> 3) + reg * 2;
    fVar49 = SQRT(__x);
    uVar3 = lVar29 - 1;
    lVar11 = 0;
    local_fc = 0;
    do {
      iVar7 = 0;
      if ((local_fc < n) && (iVar7 = 0, -1 < w)) {
        uVar28 = uVar27 - salt & uVar3;
        iVar9 = 0;
        lVar23 = (long)x;
        do {
          uVar15 = 0xffffffb066c60af8;
          uVar5 = (lVar23 * -0x4f9939f508 + (uVar28 - s48)) * lVar17 & uVar3 | -lVar29 & uVar25;
          lVar34 = 0;
          if ((long)uVar5 < (long)uVar25) {
            lVar34 = lVar29;
          }
          lVar34 = lVar34 + uVar5;
          bVar38 = true;
          if (lVar34 <= (long)((long)h + uVar25)) {
            lVar18 = lVar34 * -0x100000000;
            uVar5 = uVar25;
            do {
              iVar26 = (int)uVar5;
              iVar7 = (int)uVar15;
              uVar37 = (lVar18 >> 0x20) * 0xffe10ea9a42b +
                       (lVar23 * -0x100000000 >> 0x20) * 0xffb066c60af8 + s48 & 0xffffffffffff;
              cVar1 = '\a';
              if ((uVar37 & uVar3) == uVar28) {
                local_98 = sconf.structType;
                switch(local_98) {
                case '\x01':
                case '\x02':
                case '\x04':
                case '\x05':
                  uVar37 = uVar37 + lVar4;
                  if (radius == 0x80) {
                    uVar15 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar32 = (uint)(uVar15 >> 0x11) & 0x7fffffff;
                    iVar7 = uVar32 + (uVar32 / 3 & 0xfffffff8) * -3;
                    fVar40 = 0.0;
                    if (0x13 < iVar7) {
                      uVar32 = (uint)(uVar15 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff;
                      uVar32 = uVar32 + (uVar32 / 3 & 0xfffffff8) * -3;
                      uVar15 = (ulong)uVar32;
                      if (0x13 < (int)uVar32) {
                        uVar10 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar36 = (uint)(uVar10 >> 0x11) & 0x7fffffff;
                        iVar26 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3;
                        if (((iVar26 <= iVar7 + -0x14) &&
                            (uVar36 = (uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                            iVar12 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3,
                            iVar12 <= (int)(uVar32 - 0x14))) &&
                           (iVar19 = (iVar26 - iVar7) + 0x20, iVar8 = (iVar12 - uVar32) + 0x20,
                           (uint)(iVar8 * iVar8 + iVar19 * iVar19) < 0x100)) {
                          uVar10 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar32 = (uint)(uVar10 >> 0x11) & 0x7fffffff;
                          uVar32 = uVar32 + (uVar32 / 3 & 0xfffffff8) * -3;
                          uVar5 = (ulong)uVar32;
                          if (((int)uVar32 < 4) &&
                             (uVar36 = (uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                             iVar19 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3, 0x13 < iVar19)) {
                            uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar36 = (uint)(uVar37 >> 0x11) & 0x7fffffff;
                            iVar8 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3;
                            if ((0x13 < iVar8) &&
                               (uVar36 = (uint)(uVar37 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                               iVar35 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3, iVar35 < 4)) {
                              iVar16 = (uVar32 - iVar8) + 0x20;
                              iVar60 = (iVar35 - iVar19) + 0x20;
                              if ((uint)(iVar60 * iVar60 + iVar16 * iVar16) < 0x100) {
                                iVar16 = 0;
                                iVar60 = 0;
LAB_0012b10e:
                                fVar40 = getEnclosingRadius(iVar7,(int)uVar15,iVar26,iVar12,
                                                            (int)uVar5,iVar19,iVar8,iVar35,iVar16,
                                                            iVar16,iVar60,0x20,0x80);
                                bVar38 = fVar40 < 128.0;
LAB_0012ba73:
                                fVar40 = (float)(-(uint)bVar38 & (uint)fVar40);
                              }
                              break;
                            }
                          }
                        }
LAB_0012b89d:
                        fVar40 = 0.0;
                      }
                    }
                  }
                  else {
                    fVar40 = fVar49;
                    if (__x < 0.0) {
                      fVar40 = sqrtf(__x);
                    }
                    iVar7 = reg - (int)fVar40;
                    uVar10 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    fVar40 = 0.0;
                    uVar32 = (uint)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) %
                                   (long)iVar20);
                    uVar46 = uVar32 - iVar7;
                    uVar5 = (ulong)uVar46;
                    if (uVar46 != 0 && iVar7 <= (int)uVar32) {
                      uVar10 = (long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff
                                            ) % (long)iVar20;
                      iVar26 = (int)uVar10;
                      if (iVar7 < iVar26) {
                        uVar15 = uVar10 & 0xffffffff;
                        uVar10 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar36 = (uint)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) %
                                       (long)iVar20);
                        if ((int)uVar36 < (int)uVar46) {
                          uVar10 = (long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) &
                                                0x7fffffff) % (long)iVar20;
                          iVar12 = (int)uVar10;
                          if ((iVar12 < iVar26 - iVar7) &&
                             (uVar5 = uVar10 & 0xffffffff, iVar19 = (reg - uVar32) + uVar36,
                             iVar12 = (reg - iVar26) + iVar12,
                             (uint)(iVar12 * iVar12 + iVar19 * iVar19) <= uVar6)) {
                            uVar30 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar10 = (long)(uVar30 >> 0x11 & 0x7fffffff) % (long)iVar20;
                            local_110 = uVar10 & 0xffffffff;
                            if (((int)uVar10 < iVar20 - iVar7) &&
                               (uVar47 = (uint)((long)(ulong)((uint)(uVar30 * 0x5deece66d + 0xb >>
                                                                    0x11) & 0x7fffffff) %
                                               (long)iVar20), iVar7 < (int)uVar47)) {
                              uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                              uVar48 = (uint)((long)(ulong)((uint)(uVar37 >> 0x11) & 0x7fffffff) %
                                             (long)iVar20);
                              if ((iVar7 < (int)uVar48) &&
                                 (uVar50 = (uint)((long)(ulong)((uint)(uVar37 * 0x5deece66d + 0xb >>
                                                                      0x11) & 0x7fffffff) %
                                                 (long)iVar20), (int)uVar50 < iVar20 - iVar7))
                              goto LAB_0012ae02;
                            }
                          }
                        }
                        goto LAB_0012b89d;
                      }
                    }
                  }
                  break;
                case '\x03':
                  uVar37 = uVar37 + lVar4;
                  if (radius == 0x80) {
                    uVar15 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar32 = (uint)(uVar15 >> 0x11) & 0x7fffffff;
                    iVar7 = uVar32 + (uVar32 / 3 & 0xfffffff8) * -3;
                    fVar40 = 0.0;
                    if (0x13 < iVar7) {
                      uVar32 = (uint)(uVar15 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff;
                      uVar32 = uVar32 + (uVar32 / 3 & 0xfffffff8) * -3;
                      uVar15 = (ulong)uVar32;
                      if (0x13 < (int)uVar32) {
                        uVar10 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar36 = (uint)(uVar10 >> 0x11) & 0x7fffffff;
                        iVar26 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3;
                        if (((iVar26 <= iVar7 + -0x14) &&
                            (uVar36 = (uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                            iVar12 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3,
                            iVar12 <= (int)(uVar32 - 0x14))) &&
                           (iVar19 = (iVar26 - iVar7) + 0x20, iVar8 = (iVar12 - uVar32) + 0x20,
                           (uint)(iVar8 * iVar8 + iVar19 * iVar19) < 0x100)) {
                          uVar10 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar32 = (uint)(uVar10 >> 0x11) & 0x7fffffff;
                          uVar32 = uVar32 + (uVar32 / 3 & 0xfffffff8) * -3;
                          uVar5 = (ulong)uVar32;
                          if (((int)uVar32 < 4) &&
                             (uVar36 = (uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                             iVar19 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3, 0x13 < iVar19)) {
                            uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar36 = (uint)(uVar37 >> 0x11) & 0x7fffffff;
                            iVar8 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3;
                            if ((0x13 < iVar8) &&
                               (uVar36 = (uint)(uVar37 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                               iVar35 = uVar36 + (uVar36 / 3 & 0xfffffff8) * -3, iVar35 < 4)) {
                              iVar16 = (uVar32 - iVar8) + 0x20;
                              iVar60 = (iVar35 - iVar19) + 0x20;
                              if ((uint)(iVar60 * iVar60 + iVar16 * iVar16) < 0x100) {
                                iVar60 = 10;
                                iVar16 = 8;
                                goto LAB_0012b10e;
                              }
                              break;
                            }
                          }
                        }
                        goto LAB_0012b89d;
                      }
                    }
                  }
                  else {
                    fVar40 = fVar49;
                    if (__x < 0.0) {
                      fVar40 = sqrtf(__x);
                    }
                    iVar7 = reg - (int)fVar40;
                    uVar10 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    fVar40 = 0.0;
                    uVar32 = (uint)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) %
                                   (long)iVar20);
                    uVar46 = uVar32 - iVar7;
                    uVar5 = (ulong)uVar46;
                    if (uVar46 != 0 && iVar7 <= (int)uVar32) {
                      uVar10 = (long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff
                                            ) % (long)iVar20;
                      iVar26 = (int)uVar10;
                      if (iVar7 < iVar26) {
                        uVar15 = uVar10 & 0xffffffff;
                        uVar10 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar36 = (uint)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) %
                                       (long)iVar20);
                        if ((int)uVar36 < (int)uVar46) {
                          uVar10 = (long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) &
                                                0x7fffffff) % (long)iVar20;
                          uVar46 = (uint)uVar10;
                          if (((int)uVar46 < iVar26 - iVar7) &&
                             (uVar5 = uVar10 & 0xffffffff, iVar12 = (reg - uVar32) + uVar36,
                             iVar26 = (reg - iVar26) + uVar46,
                             (uint)(iVar26 * iVar26 + iVar12 * iVar12) <= uVar6)) {
                            uVar31 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar30 = (long)(uVar31 >> 0x11 & 0x7fffffff) % (long)iVar20;
                            uVar10 = uVar30 & 0xffffffff;
                            iVar26 = (int)uVar30;
                            local_110 = uVar10;
                            if ((iVar26 < iVar20 - iVar7) &&
                               (uVar47 = (uint)((long)(ulong)((uint)(uVar31 * 0x5deece66d + 0xb >>
                                                                    0x11) & 0x7fffffff) %
                                               (long)iVar20), iVar7 < (int)uVar47)) {
                              uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                              uVar48 = (uint)((long)(ulong)((uint)(uVar37 >> 0x11) & 0x7fffffff) %
                                             (long)iVar20);
                              if ((iVar7 < (int)uVar48) &&
                                 (uVar50 = (uint)((long)(ulong)((uint)(uVar37 * 0x5deece66d + 0xb >>
                                                                      0x11) & 0x7fffffff) %
                                                 (long)iVar20), (int)uVar50 < iVar20 - iVar7)) {
                                iVar7 = (iVar26 + reg) - uVar48;
                                iVar26 = (reg - uVar47) + uVar50;
                                if ((uint)(iVar26 * iVar26 + iVar7 * iVar7) <= uVar6) {
                                  iVar12 = 10;
                                  iVar26 = 8;
                                  iVar7 = iVar26;
                                  goto LAB_0012ba51;
                                }
                                break;
                              }
                            }
                          }
                        }
                        goto LAB_0012b89d;
                      }
                    }
                  }
                  break;
                case '\x06':
                case '\a':
                case '\v':
                  fVar40 = fVar49;
                  if (__x < 0.0) {
                    fVar40 = sqrtf(__x);
                  }
                  uVar37 = uVar37 + lVar4;
                  iVar7 = reg - (int)fVar40;
                  uVar10 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  fVar40 = 0.0;
                  uVar32 = (uint)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) % (long)iVar20)
                  ;
                  if (iVar7 < (int)uVar32) {
                    uVar10 = (long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff)
                             % (long)iVar20;
                    iVar26 = (int)uVar10;
                    if (iVar7 < iVar26) {
                      uVar15 = uVar10 & 0xffffffff;
                      uVar5 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar36 = (uint)((long)(ulong)((uint)(uVar5 >> 0x11) & 0x7fffffff) %
                                     (long)iVar20);
                      if ((int)uVar36 < (int)(uVar32 - iVar7)) {
                        uVar5 = (ulong)((uint)(uVar5 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff);
                        iVar12 = (int)((long)uVar5 % (long)iVar20);
                        if ((iVar12 < iVar26 - iVar7) &&
                           (uVar5 = (long)uVar5 % (long)iVar20 & 0xffffffff,
                           iVar19 = (reg - uVar32) + uVar36, iVar12 = (reg - iVar26) + iVar12,
                           (uint)(iVar12 * iVar12 + iVar19 * iVar19) <= uVar6)) {
                          uVar30 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar10 = (long)(uVar30 >> 0x11 & 0x7fffffff) % (long)iVar20;
                          local_110 = uVar10 & 0xffffffff;
                          if (((int)uVar10 < iVar20 - iVar7) &&
                             (uVar47 = (uint)((long)(ulong)((uint)(uVar30 * 0x5deece66d + 0xb >>
                                                                  0x11) & 0x7fffffff) % (long)iVar20
                                             ), iVar7 < (int)uVar47)) {
                            uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar48 = (uint)((long)(ulong)((uint)(uVar37 >> 0x11) & 0x7fffffff) %
                                           (long)iVar20);
                            if ((iVar7 < (int)uVar48) &&
                               (uVar50 = (uint)((long)(ulong)((uint)(uVar37 * 0x5deece66d + 0xb >>
                                                                    0x11) & 0x7fffffff) %
                                               (long)iVar20), (int)uVar50 < iVar20 - iVar7)) {
LAB_0012ae02:
                              uVar46 = (uint)uVar5;
                              fVar40 = 0.0;
                              iVar7 = ((int)local_110 + reg) - uVar48;
                              iVar26 = (reg - uVar47) + uVar50;
                              if ((uint)(iVar26 * iVar26 + iVar7 * iVar7) <= uVar6) {
                                iVar26 = 0;
                                iVar12 = 0;
                                uVar10 = local_110;
                                iVar7 = iVar26;
LAB_0012ba51:
                                fVar40 = getEnclosingRadius(uVar32,(int)uVar15,uVar36,uVar46,
                                                            (int)uVar10,uVar47,uVar48,uVar50,iVar26,
                                                            iVar7,iVar12,reg,radius);
                                bVar38 = fVar40 < fVar39;
                                uVar5 = uVar10;
                                goto LAB_0012ba73;
                              }
                              break;
                            }
                          }
                        }
                      }
                      goto LAB_0012b89d;
                    }
                  }
                  break;
                case '\b':
                  uVar37 = uVar37 + lVar4;
                  uVar5 = 0x5deece66d;
                  uVar30 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar10 = (long)(ulong)((uint)(uVar30 >> 0x11) & 0x7fffffff) % (long)iVar20;
                  uVar15 = uVar10 & 0xffffffff;
                  uVar30 = uVar30 * 0x5deece66d + 0xb;
                  uVar32 = (int)((long)(ulong)((uint)(uVar30 >> 0x11) & 0x7fffffff) % (long)iVar20)
                           + (int)uVar10;
                  fVar40 = 0.0;
                  if (iVar2 < (int)uVar32) {
                    uVar10 = uVar30 * 0x5deece66d + 0xb;
                    uVar15 = (long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) % (long)iVar20;
                    uVar5 = uVar15 & 0xffffffff;
                    uVar53 = (int)((long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) &
                                                0x7fffffff) % (long)iVar20) + (int)uVar15;
                    uVar15 = (ulong)uVar53;
                    if (iVar2 < (int)uVar53) {
                      uVar10 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar5 = uVar10 * 0x5deece66d + 0xb;
                      uVar36 = (int)((long)(uVar5 >> 0x11 & 0x7fffffff) % (long)iVar20) +
                               (int)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) %
                                    (long)iVar20);
                      if ((int)uVar36 <= (int)(uVar32 - iVar2)) {
                        uVar10 = uVar5 * 0x5deece66d + 0xb;
                        uVar5 = (ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff);
                        uVar46 = (int)((long)uVar5 % (long)iVar20) +
                                 (int)((long)(uVar10 >> 0x11 & 0x7fffffff) % (long)iVar20);
                        if (((int)uVar46 <= (int)(uVar53 - iVar2)) &&
                           (iVar7 = (int)(uVar36 - uVar32) >> 1,
                           iVar26 = (int)(uVar46 - uVar53) >> 1,
                           (ulong)(uint)(iVar26 * iVar26 + iVar7 * iVar7) <=
                           (ulong)((long)radius * (long)radius * 4))) {
                          uVar5 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar10 = (long)(uVar5 >> 0x11 & 0x7fffffff) % (long)iVar20;
                          local_110 = uVar10 & 0xffffffff;
                          uVar5 = uVar5 * 0x5deece66d + 0xb;
                          uVar54 = (int)((long)(uVar5 >> 0x11 & 0x7fffffff) % (long)iVar20) +
                                   (int)uVar10;
                          if ((int)uVar54 <= (int)(uVar32 - iVar2)) {
                            uVar10 = uVar5 * 0x5deece66d + 0xb;
                            uVar5 = (ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff)
                            ;
                            uVar47 = (int)((long)uVar5 % (long)iVar20) +
                                     (int)((long)(uVar10 >> 0x11 & 0x7fffffff) % (long)iVar20);
                            local_110 = (ulong)uVar47;
                            if (iVar2 < (int)uVar47) {
                              uVar5 = 0x5deece66d;
                              uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                              uVar10 = uVar37 * 0x5deece66d + 0xb;
                              uVar48 = (int)((long)(uVar10 >> 0x11 & 0x7fffffff) % (long)iVar20) +
                                       (int)((long)(uVar37 >> 0x11 & 0x7fffffff) % (long)iVar20);
                              if (iVar2 < (int)uVar48) {
                                uVar37 = uVar10 * 0x5deece66d + 0xb;
                                uVar50 = (int)((long)(ulong)((uint)(uVar37 * 0x5deece66d + 0xb >>
                                                                   0x11) & 0x7fffffff) %
                                              (long)iVar20) +
                                         (int)((long)(uVar37 >> 0x11 & 0x7fffffff) % (long)iVar20);
                                if ((int)uVar50 <= (int)(uVar53 - iVar2)) {
                                  uVar32 = uVar32 >> 1;
                                  uVar15 = (ulong)(uVar53 >> 1);
                                  uVar36 = uVar36 >> 1;
                                  uVar46 = uVar46 >> 1;
                                  uVar47 = uVar47 >> 1;
                                  uVar48 = uVar48 >> 1;
                                  uVar50 = uVar50 >> 1;
                                  iVar12 = 0x3a;
                                  iVar26 = 0x3a;
                                  uVar10 = (ulong)(uVar54 >> 1);
                                  iVar7 = 0x17;
                                  goto LAB_0012ba51;
                                }
                                break;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0012b89d;
                    }
                  }
                  break;
                default:
                  iVar2 = (int)&switchD_0012a71e::switchdataD_00188db0;
                  uVar32 = (uint)sconf._6_2_;
                  scanForQuads_cold_1();
                  iVar19 = iVar7 * 0x10;
                  iVar12 = (extraout_EDX + (int)fVar39) * 0x10 + (int)local_110;
                  iVar9 = (iVar2 + (int)fVar39) * 0x10 + uVar6;
                  local_110._0_4_ = (iVar26 + (int)fVar39) * 0x10 + (int)local_110;
                  iVar26 = (int)uVar28;
                  iVar20 = ((int)fVar39 + iVar20) * 0x10 + uVar6;
                  iVar2 = (int)local_110;
                  if ((int)local_110 < iVar12) {
                    iVar2 = iVar12;
                  }
                  iVar8 = iVar20;
                  if (iVar20 < iVar9) {
                    iVar8 = iVar9;
                  }
                  iVar35 = iVar26 * 0x10;
                  if (SBORROW4(iVar19,iVar26 * 0x10) != iVar19 + iVar26 * -0x10 < 0) {
                    iVar35 = iVar19;
                  }
                  uVar6 = 0x7fffffff;
                  if (iVar8 - radius <= iVar35 + radius) {
                    iVar16 = iVar2 - radius;
                    iVar19 = (int)fVar49 * 0x10;
                    if ((int)(uVar32 * 0x10) < (int)fVar49 * 0x10) {
                      iVar19 = uVar32 * 0x10;
                    }
                    uVar36 = (iVar19 + radius * 2) - iVar2;
                    uVar6 = 0x7fffffff;
                    uStackY_170 = uVar36 ^ 0x80000000;
                    uStackY_16c = uVar36 ^ 0x80000000;
                    uStack_164 = uVar36 ^ 0x80000000;
                    iVar2 = iVar8 - radius;
                    do {
                      if (iVar16 <= iVar19 + radius) {
                        iVar13 = (iVar2 - iVar20) * (iVar2 - iVar20);
                        iVar21 = iVar2 + iVar26 * -0x10;
                        iVar21 = iVar21 * iVar21;
                        iVar24 = (iVar2 - iVar9) * (iVar2 - iVar9);
                        iVar33 = iVar2 + iVar7 * -0x10;
                        iVar33 = iVar33 * iVar33;
                        iVar8 = 4;
                        uVar46 = uVar6;
                        uVar47 = uVar6;
                        uVar48 = uVar6;
                        iVar60 = iVar16;
                        iVar61 = iVar16 + 1;
                        iVar62 = iVar16 + 2;
                        iVar63 = iVar16 + 3;
                        do {
                          uVar59 = uVar48;
                          uVar58 = uVar47;
                          uVar57 = uVar46;
                          uVar56 = uVar6;
                          auVar65._0_4_ = iVar60 + uVar32 * -0x10;
                          auVar65._4_4_ = iVar61 + uVar32 * -0x10;
                          auVar65._8_4_ = iVar62 + uVar32 * -0x10;
                          auVar65._12_4_ = iVar63 + uVar32 * -0x10;
                          auVar51._4_4_ = auVar65._4_4_;
                          auVar51._0_4_ = auVar65._4_4_;
                          auVar51._8_4_ = auVar65._12_4_;
                          auVar51._12_4_ = auVar65._12_4_;
                          uVar64 = auVar65._0_4_ * auVar65._0_4_ + iVar33;
                          uVar66 = auVar65._4_4_ * auVar65._4_4_ + iVar33;
                          uVar67 = (int)((auVar65._8_8_ & 0xffffffff) * (auVar65._8_8_ & 0xffffffff)
                                        ) + iVar33;
                          uVar68 = (int)((auVar51._8_8_ & 0xffffffff) * (auVar51._8_8_ & 0xffffffff)
                                        ) + iVar33;
                          auVar52._0_4_ = iVar60 - iVar12;
                          auVar52._4_4_ = iVar61 - iVar12;
                          auVar52._8_4_ = iVar62 - iVar12;
                          auVar52._12_4_ = iVar63 - iVar12;
                          auVar41._4_4_ = auVar52._4_4_;
                          auVar41._0_4_ = auVar52._4_4_;
                          auVar41._8_4_ = auVar52._12_4_;
                          auVar41._12_4_ = auVar52._12_4_;
                          uVar6 = auVar52._0_4_ * auVar52._0_4_ + iVar24;
                          uVar46 = auVar52._4_4_ * auVar52._4_4_ + iVar24;
                          uVar47 = (int)((auVar52._8_8_ & 0xffffffff) * (auVar52._8_8_ & 0xffffffff)
                                        ) + iVar24;
                          uVar48 = (int)((auVar41._8_8_ & 0xffffffff) * (auVar41._8_8_ & 0xffffffff)
                                        ) + iVar24;
                          uVar50 = -(uint)((int)(uVar64 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
                          uVar53 = -(uint)((int)(uVar66 ^ 0x80000000) < (int)(uVar46 ^ 0x80000000));
                          uVar54 = -(uint)((int)(uVar67 ^ 0x80000000) < (int)(uVar47 ^ 0x80000000));
                          uVar55 = -(uint)((int)(uVar68 ^ 0x80000000) < (int)(uVar48 ^ 0x80000000));
                          uVar50 = ~uVar50 & uVar64 | uVar6 & uVar50;
                          uVar53 = ~uVar53 & uVar66 | uVar46 & uVar53;
                          uVar54 = ~uVar54 & uVar67 | uVar47 & uVar54;
                          uVar55 = ~uVar55 & uVar68 | uVar48 & uVar55;
                          auVar42._0_4_ = iVar60 - (int)local_110;
                          auVar42._4_4_ = iVar61 - (int)local_110;
                          auVar42._8_4_ = iVar62 - (int)local_110;
                          auVar42._12_4_ = iVar63 - (int)local_110;
                          auVar44._4_4_ = auVar42._4_4_;
                          auVar44._0_4_ = auVar42._4_4_;
                          auVar44._8_4_ = auVar42._12_4_;
                          auVar44._12_4_ = auVar42._12_4_;
                          uVar6 = auVar42._0_4_ * auVar42._0_4_ + iVar21;
                          uVar46 = auVar42._4_4_ * auVar42._4_4_ + iVar21;
                          uVar47 = (int)((auVar42._8_8_ & 0xffffffff) * (auVar42._8_8_ & 0xffffffff)
                                        ) + iVar21;
                          uVar48 = (int)((auVar44._8_8_ & 0xffffffff) * (auVar44._8_8_ & 0xffffffff)
                                        ) + iVar21;
                          uVar64 = -(uint)((int)(uVar50 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
                          uVar66 = -(uint)((int)(uVar53 ^ 0x80000000) < (int)(uVar46 ^ 0x80000000));
                          uVar67 = -(uint)((int)(uVar54 ^ 0x80000000) < (int)(uVar47 ^ 0x80000000));
                          uVar68 = -(uint)((int)(uVar55 ^ 0x80000000) < (int)(uVar48 ^ 0x80000000));
                          uVar64 = ~uVar64 & uVar50 | uVar6 & uVar64;
                          uVar66 = ~uVar66 & uVar53 | uVar46 & uVar66;
                          uVar67 = ~uVar67 & uVar54 | uVar47 & uVar67;
                          uVar68 = ~uVar68 & uVar55 | uVar48 & uVar68;
                          auVar43._0_4_ = iVar60 + (int)fVar49 * -0x10;
                          auVar43._4_4_ = iVar61 + (int)fVar49 * -0x10;
                          auVar43._8_4_ = iVar62 + (int)fVar49 * -0x10;
                          auVar43._12_4_ = iVar63 + (int)fVar49 * -0x10;
                          auVar45._4_4_ = auVar43._4_4_;
                          auVar45._0_4_ = auVar43._4_4_;
                          auVar45._8_4_ = auVar43._12_4_;
                          auVar45._12_4_ = auVar43._12_4_;
                          uVar6 = auVar43._0_4_ * auVar43._0_4_ + iVar13;
                          uVar46 = auVar43._4_4_ * auVar43._4_4_ + iVar13;
                          uVar47 = (int)((auVar43._8_8_ & 0xffffffff) * (auVar43._8_8_ & 0xffffffff)
                                        ) + iVar13;
                          uVar48 = (int)((auVar45._8_8_ & 0xffffffff) * (auVar45._8_8_ & 0xffffffff)
                                        ) + iVar13;
                          uVar50 = -(uint)((int)(uVar64 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000));
                          uVar53 = -(uint)((int)(uVar66 ^ 0x80000000) < (int)(uVar46 ^ 0x80000000));
                          uVar54 = -(uint)((int)(uVar67 ^ 0x80000000) < (int)(uVar47 ^ 0x80000000));
                          uVar55 = -(uint)((int)(uVar68 ^ 0x80000000) < (int)(uVar48 ^ 0x80000000));
                          uVar6 = ~uVar50 & uVar64 | uVar6 & uVar50;
                          uVar46 = ~uVar53 & uVar66 | uVar46 & uVar53;
                          uVar47 = ~uVar54 & uVar67 | uVar47 & uVar54;
                          uVar48 = ~uVar55 & uVar68 | uVar48 & uVar55;
                          uVar50 = -(uint)((int)uVar6 < (int)uVar56);
                          uVar53 = -(uint)((int)uVar46 < (int)uVar57);
                          uVar54 = -(uint)((int)uVar47 < (int)uVar58);
                          uVar55 = -(uint)((int)uVar48 < (int)uVar59);
                          uVar6 = ~uVar50 & uVar56 | uVar6 & uVar50;
                          uVar46 = ~uVar53 & uVar57 | uVar46 & uVar53;
                          uVar47 = ~uVar54 & uVar58 | uVar47 & uVar54;
                          uVar48 = ~uVar55 & uVar59 | uVar48 & uVar55;
                          iVar60 = iVar60 + 4;
                          iVar61 = iVar61 + 4;
                          iVar62 = iVar62 + 4;
                          iVar63 = iVar63 + 4;
                          iVar14 = iVar8 + -4;
                          iVar22 = iVar8 + (uVar36 + 4 & 0xfffffffc);
                          iVar8 = iVar14;
                        } while (iVar22 != 8);
                        uVar50 = -iVar14;
                        uVar53 = -(uint)((int)uStackY_170 < (int)(uVar50 ^ 0x80000000));
                        uVar54 = -(uint)((int)uStackY_16c < (int)((uVar50 | 1) ^ 0x80000000));
                        uVar55 = -(uint)((int)(uVar36 ^ 0x80000000) <
                                        (int)((uVar50 | 2) ^ 0x80000000));
                        uVar50 = -(uint)((int)uStack_164 < (int)((uVar50 | 3) ^ 0x80000000));
                        uVar6 = ~uVar53 & uVar6 | uVar56 & uVar53;
                        uVar46 = ~uVar54 & uVar46 | uVar57 & uVar54;
                        uVar47 = ~uVar55 & uVar47 | uVar58 & uVar55;
                        uVar48 = ~uVar50 & uVar48 | uVar59 & uVar50;
                        uVar50 = -(uint)((int)uVar6 < (int)uVar47);
                        uVar53 = -(uint)((int)uVar46 < (int)uVar48);
                        uVar47 = ~uVar50 & uVar47 | uVar6 & uVar50;
                        uVar46 = ~uVar53 & uVar48 | uVar46 & uVar53;
                        uVar6 = -(uint)((int)uVar47 < (int)uVar46);
                        uVar6 = ~uVar6 & uVar46 | uVar47 & uVar6;
                      }
                      bVar38 = iVar2 != iVar35 + radius;
                      iVar2 = iVar2 + 1;
                    } while (bVar38);
                  }
                  if (uVar6 != 0x7fffffff) {
                    iVar20 = reg * reg;
                    fVar39 = (float)iVar20 * 0.25 + (float)(int)uVar6;
                    if (fVar39 < 0.0) {
                      sqrtf(fVar39);
                      return extraout_EAX;
                    }
                  }
                  return iVar20;
                case '\n':
                  fVar40 = fVar49;
                  if (__x < 0.0) {
                    fVar40 = sqrtf(__x);
                  }
                  uVar37 = uVar37 + lVar4;
                  iVar7 = reg - (int)fVar40;
                  uVar10 = (uVar37 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  fVar40 = 0.0;
                  uVar32 = (uint)((long)(ulong)((uint)(uVar10 >> 0x11) & 0x7fffffff) % (long)iVar20)
                  ;
                  if (iVar7 < (int)uVar32) {
                    uVar10 = (long)(ulong)((uint)(uVar10 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff)
                             % (long)iVar20;
                    iVar26 = (int)uVar10;
                    if (iVar7 < iVar26) {
                      uVar15 = uVar10 & 0xffffffff;
                      uVar5 = (uVar37 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar36 = (uint)((long)(ulong)((uint)(uVar5 >> 0x11) & 0x7fffffff) %
                                     (long)iVar20);
                      if ((int)uVar36 < (int)(uVar32 - iVar7)) {
                        uVar5 = (ulong)((uint)(uVar5 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff);
                        uVar46 = (uint)((long)uVar5 % (long)iVar20);
                        if (((int)uVar46 < iVar26 - iVar7) &&
                           (uVar5 = (long)uVar5 % (long)iVar20 & 0xffffffff,
                           iVar12 = (reg - uVar32) + uVar36, iVar26 = (reg - iVar26) + uVar46,
                           (uint)(iVar26 * iVar26 + iVar12 * iVar12) <= uVar6)) {
                          uVar30 = (uVar37 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar10 = (long)(uVar30 >> 0x11 & 0x7fffffff) % (long)iVar20;
                          local_110 = uVar10 & 0xffffffff;
                          iVar26 = (int)uVar10;
                          if ((iVar26 < iVar20 - iVar7) &&
                             (uVar47 = (uint)((long)(ulong)((uint)(uVar30 * 0x5deece66d + 0xb >>
                                                                  0x11) & 0x7fffffff) % (long)iVar20
                                             ), iVar7 < (int)uVar47)) {
                            uVar37 = (uVar37 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar48 = (uint)((long)(ulong)((uint)(uVar37 >> 0x11) & 0x7fffffff) %
                                           (long)iVar20);
                            if ((iVar7 < (int)uVar48) &&
                               (uVar50 = (uint)((long)(ulong)((uint)(uVar37 * 0x5deece66d + 0xb >>
                                                                    0x11) & 0x7fffffff) %
                                               (long)iVar20), (int)uVar50 < iVar20 - iVar7)) {
                              iVar7 = (iVar26 + reg) - uVar48;
                              iVar26 = (reg - uVar47) + uVar50;
                              if ((uint)(iVar26 * iVar26 + iVar7 * iVar7) <= uVar6) {
                                iVar26 = 0x48;
                                iVar12 = 0x48;
                                uVar10 = local_110;
                                iVar7 = 0x36;
                                goto LAB_0012ba51;
                              }
                              break;
                            }
                          }
                        }
                      }
                      goto LAB_0012b89d;
                    }
                  }
                }
                if ((fVar40 != 0.0) || (NAN(fVar40))) {
                  qplist[(long)local_fc + (long)iVar9].x = (int)lVar23;
                  qplist[(long)local_fc + (long)iVar9].z = (int)lVar34;
                  iVar9 = iVar9 + 1;
                  cVar1 = n - local_fc <= iVar9;
                  if (n - local_fc <= iVar9) {
                    local_dc = iVar9;
                  }
                }
                else {
                  cVar1 = '\0';
                }
              }
              if ((cVar1 != '\a') && (cVar1 != '\0')) goto LAB_0012ba7d;
              lVar34 = lVar34 + lVar29;
              lVar18 = lVar18 - (lVar29 << 0x20);
            } while (lVar34 <= (long)((long)h + uVar25));
            cVar1 = '\0';
LAB_0012ba7d:
            bVar38 = cVar1 == '\0';
          }
          iVar7 = local_dc;
        } while ((bVar38) &&
                (bVar38 = lVar23 < (long)w + (long)x, lVar23 = lVar23 + 1, iVar7 = iVar9, bVar38));
      }
      local_fc = local_fc + iVar7;
      if (n <= local_fc) {
        return local_fc;
      }
      uVar27 = lowBits[lVar11 + 1];
      lVar11 = lVar11 + 1;
    } while (uVar27 != 0);
  }
  return local_fc;
}

Assistant:

int scanForQuads(
        const StructureConfig sconf, int radius, uint64_t s48,
        const uint64_t *lowBits, int lowBitN, uint64_t salt,
        int x, int z, int w, int h, Pos *qplist, int n)
{
    int i, cnt = 0;
    uint64_t invB;
    if (lowBitN == 20)
        invB = 132477ULL;
    else if (lowBitN == 48)
        invB = 211541297333629ULL;
    else
        invB = mulInv(132897987541ULL, (1ULL << lowBitN));

    for (i = 0; lowBits[i]; i++)
    {
        cnt += scanForQuadBits(sconf, radius, s48, lowBits[i]-salt, lowBitN, invB,
                x, z, w, h, qplist+cnt, n-cnt);
        if (cnt >= n)
            break;
    }

    return cnt;
}